

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuCreateTargetSchema(sqlite3rbu *p)

{
  char *pStmt;
  int iVar1;
  uchar *zSql_00;
  sqlite3_value *pValue;
  bool bVar2;
  int local_2c;
  int i;
  char *zSql;
  sqlite3_stmt *pInsert;
  sqlite3_stmt *pSql;
  sqlite3rbu *p_local;
  
  pInsert = (sqlite3_stmt *)0x0;
  zSql = (char *)0x0;
  pSql = (sqlite3_stmt *)p;
  iVar1 = sqlite3_exec(p->dbMain,"PRAGMA writable_schema=1",(sqlite3_callback)0x0,(void *)0x0,
                       &p->zErrmsg);
  *(int *)(pSql + 0x38) = iVar1;
  if (*(int *)(pSql + 0x38) == 0) {
    iVar1 = prepareAndCollectError
                      (*(sqlite3 **)(pSql + 0x10),&pInsert,(char **)(pSql + 0x40),
                       "SELECT sql FROM sqlite_master WHERE sql!=\'\' AND rootpage!=0 AND name!=\'sqlite_sequence\'  ORDER BY type DESC"
                      );
    *(int *)(pSql + 0x38) = iVar1;
  }
  while( true ) {
    bVar2 = false;
    if (*(int *)(pSql + 0x38) == 0) {
      iVar1 = sqlite3_step(pInsert);
      bVar2 = iVar1 == 100;
    }
    if (!bVar2) break;
    zSql_00 = sqlite3_column_text(pInsert,0);
    iVar1 = sqlite3_exec(*(sqlite3 **)(pSql + 8),(char *)zSql_00,(sqlite3_callback)0x0,(void *)0x0,
                         (char **)(pSql + 0x40));
    *(int *)(pSql + 0x38) = iVar1;
  }
  rbuFinalize((sqlite3rbu *)pSql,pInsert);
  if (*(int *)(pSql + 0x38) == 0) {
    if (*(int *)(pSql + 0x38) == 0) {
      iVar1 = prepareAndCollectError
                        (*(sqlite3 **)(pSql + 0x10),&pInsert,(char **)(pSql + 0x40),
                         "SELECT * FROM sqlite_master WHERE rootpage=0 OR rootpage IS NULL");
      *(int *)(pSql + 0x38) = iVar1;
    }
    if (*(int *)(pSql + 0x38) == 0) {
      iVar1 = prepareAndCollectError
                        (*(sqlite3 **)(pSql + 8),(sqlite3_stmt **)&zSql,(char **)(pSql + 0x40),
                         "INSERT INTO sqlite_master VALUES(?,?,?,?,?)");
      *(int *)(pSql + 0x38) = iVar1;
    }
    while( true ) {
      bVar2 = false;
      if (*(int *)(pSql + 0x38) == 0) {
        iVar1 = sqlite3_step(pInsert);
        bVar2 = iVar1 == 100;
      }
      if (!bVar2) break;
      for (local_2c = 0; pStmt = zSql, local_2c < 5; local_2c = local_2c + 1) {
        pValue = sqlite3_column_value(pInsert,local_2c);
        sqlite3_bind_value((sqlite3_stmt *)pStmt,local_2c + 1,pValue);
      }
      sqlite3_step((sqlite3_stmt *)zSql);
      iVar1 = sqlite3_reset((sqlite3_stmt *)zSql);
      *(int *)(pSql + 0x38) = iVar1;
    }
    if (*(int *)(pSql + 0x38) == 0) {
      iVar1 = sqlite3_exec(*(sqlite3 **)(pSql + 8),"PRAGMA writable_schema=0",(sqlite3_callback)0x0,
                           (void *)0x0,(char **)(pSql + 0x40));
      *(int *)(pSql + 0x38) = iVar1;
    }
    rbuFinalize((sqlite3rbu *)pSql,pInsert);
    rbuFinalize((sqlite3rbu *)pSql,(sqlite3_stmt *)zSql);
  }
  return;
}

Assistant:

static void rbuCreateTargetSchema(sqlite3rbu *p){
  sqlite3_stmt *pSql = 0;
  sqlite3_stmt *pInsert = 0;

  assert( rbuIsVacuum(p) );
  p->rc = sqlite3_exec(p->dbMain, "PRAGMA writable_schema=1", 0,0, &p->zErrmsg);
  if( p->rc==SQLITE_OK ){
    p->rc = prepareAndCollectError(p->dbRbu, &pSql, &p->zErrmsg, 
      "SELECT sql FROM sqlite_master WHERE sql!='' AND rootpage!=0"
      " AND name!='sqlite_sequence' "
      " ORDER BY type DESC"
    );
  }

  while( p->rc==SQLITE_OK && sqlite3_step(pSql)==SQLITE_ROW ){
    const char *zSql = (const char*)sqlite3_column_text(pSql, 0);
    p->rc = sqlite3_exec(p->dbMain, zSql, 0, 0, &p->zErrmsg);
  }
  rbuFinalize(p, pSql);
  if( p->rc!=SQLITE_OK ) return;

  if( p->rc==SQLITE_OK ){
    p->rc = prepareAndCollectError(p->dbRbu, &pSql, &p->zErrmsg, 
        "SELECT * FROM sqlite_master WHERE rootpage=0 OR rootpage IS NULL" 
    );
  }

  if( p->rc==SQLITE_OK ){
    p->rc = prepareAndCollectError(p->dbMain, &pInsert, &p->zErrmsg, 
        "INSERT INTO sqlite_master VALUES(?,?,?,?,?)"
    );
  }

  while( p->rc==SQLITE_OK && sqlite3_step(pSql)==SQLITE_ROW ){
    int i;
    for(i=0; i<5; i++){
      sqlite3_bind_value(pInsert, i+1, sqlite3_column_value(pSql, i));
    }
    sqlite3_step(pInsert);
    p->rc = sqlite3_reset(pInsert);
  }
  if( p->rc==SQLITE_OK ){
    p->rc = sqlite3_exec(p->dbMain, "PRAGMA writable_schema=0",0,0,&p->zErrmsg);
  }

  rbuFinalize(p, pSql);
  rbuFinalize(p, pInsert);
}